

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O0

Opnd * __thiscall IR::Instr::UnlinkSrc2(Instr *this)

{
  Opnd *this_00;
  Opnd *oldSrc;
  Instr *this_local;
  
  this_00 = this->m_src2;
  Opnd::UnUse(this_00);
  this->m_src2 = (Opnd *)0x0;
  return this_00;
}

Assistant:

Opnd *
Instr::UnlinkSrc2()
{
    Opnd * oldSrc = this->m_src2;
    oldSrc->UnUse();
    this->m_src2 = nullptr;

    return oldSrc;
}